

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int nonce_function_rfc6979
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *algo16,void *data,uint counter)

{
  long in_RCX;
  long in_R8;
  uint in_R9D;
  uchar msgmod32 [32];
  secp256k1_scalar msg;
  uint i;
  secp256k1_rfc6979_hmac_sha256 rng;
  uint offset;
  uchar keydata [112];
  undefined4 in_stack_fffffffffffffec8;
  uint in_stack_fffffffffffffecc;
  int *in_stack_fffffffffffffed0;
  uint *in_stack_fffffffffffffed8;
  secp256k1_scalar *in_stack_fffffffffffffee0;
  uint local_f4;
  undefined1 local_a8 [56];
  size_t in_stack_ffffffffffffff90;
  uchar *in_stack_ffffffffffffff98;
  secp256k1_rfc6979_hmac_sha256 *in_stack_ffffffffffffffa0;
  
  secp256k1_scalar_set_b32
            (in_stack_fffffffffffffee0,(uchar *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0)
  ;
  secp256k1_scalar_get_b32
            ((uchar *)in_stack_fffffffffffffed0,
             (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  buffer_append((uchar *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  buffer_append((uchar *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  if (in_R8 != 0) {
    buffer_append((uchar *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                  in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  }
  if (in_RCX != 0) {
    buffer_append((uchar *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                  in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  }
  secp256k1_rfc6979_hmac_sha256_initialize
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  memset(local_a8,0,0x70);
  for (local_f4 = 0; local_f4 <= in_R9D; local_f4 = local_f4 + 1) {
    secp256k1_rfc6979_hmac_sha256_generate
              ((secp256k1_rfc6979_hmac_sha256 *)rng.k._24_8_,(uchar *)rng.k._16_8_,rng.k._8_8_);
  }
  secp256k1_rfc6979_hmac_sha256_finalize((secp256k1_rfc6979_hmac_sha256 *)0x10acf70);
  return 1;
}

Assistant:

static int nonce_function_rfc6979(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *algo16, void *data, unsigned int counter) {
   unsigned char keydata[112];
   unsigned int offset = 0;
   secp256k1_rfc6979_hmac_sha256 rng;
   unsigned int i;
   secp256k1_scalar msg;
   unsigned char msgmod32[32];
   secp256k1_scalar_set_b32(&msg, msg32, NULL);
   secp256k1_scalar_get_b32(msgmod32, &msg);
   /* We feed a byte array to the PRNG as input, consisting of:
    * - the private key (32 bytes) and reduced message (32 bytes), see RFC 6979 3.2d.
    * - optionally 32 extra bytes of data, see RFC 6979 3.6 Additional Data.
    * - optionally 16 extra bytes with the algorithm name.
    * Because the arguments have distinct fixed lengths it is not possible for
    *  different argument mixtures to emulate each other and result in the same
    *  nonces.
    */
   buffer_append(keydata, &offset, key32, 32);
   buffer_append(keydata, &offset, msgmod32, 32);
   if (data != NULL) {
       buffer_append(keydata, &offset, data, 32);
   }
   if (algo16 != NULL) {
       buffer_append(keydata, &offset, algo16, 16);
   }
   secp256k1_rfc6979_hmac_sha256_initialize(&rng, keydata, offset);
   memset(keydata, 0, sizeof(keydata));
   for (i = 0; i <= counter; i++) {
       secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
   }
   secp256k1_rfc6979_hmac_sha256_finalize(&rng);
   return 1;
}